

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

char * anon_unknown.dwarf_ef3ef5::getShapeForTarget(cmLinkItem *item)

{
  TargetType TVar1;
  cmLinkItem *item_local;
  
  if (item->Target == (cmGeneratorTarget *)0x0) {
    item_local = (cmLinkItem *)anon_var_dwarf_ef40ce;
  }
  else {
    TVar1 = cmGeneratorTarget::GetType(item->Target);
    switch(TVar1) {
    case EXECUTABLE:
      item_local = (cmLinkItem *)anon_var_dwarf_ef3edc;
      break;
    case STATIC_LIBRARY:
      item_local = (cmLinkItem *)0xdeb7ac;
      break;
    case SHARED_LIBRARY:
      item_local = (cmLinkItem *)anon_var_dwarf_ef403a;
      break;
    case MODULE_LIBRARY:
      item_local = (cmLinkItem *)anon_var_dwarf_ef405f;
      break;
    case OBJECT_LIBRARY:
      item_local = (cmLinkItem *)anon_var_dwarf_ef40a9;
      break;
    case UTILITY:
      item_local = (cmLinkItem *)anon_var_dwarf_ef40f3;
      break;
    case INTERFACE_LIBRARY:
      item_local = (cmLinkItem *)anon_var_dwarf_ef4084;
      break;
    case UNKNOWN_LIBRARY:
    default:
      item_local = (cmLinkItem *)anon_var_dwarf_ef40ce;
    }
  }
  return (char *)item_local;
}

Assistant:

const char* getShapeForTarget(const cmLinkItem& item)
{
  if (item.Target == nullptr) {
    return GRAPHVIZ_NODE_SHAPE_LIBRARY_UNKNOWN;
  }

  switch (item.Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      return GRAPHVIZ_NODE_SHAPE_EXECUTABLE;
    case cmStateEnums::STATIC_LIBRARY:
      return GRAPHVIZ_NODE_SHAPE_LIBRARY_STATIC;
    case cmStateEnums::SHARED_LIBRARY:
      return GRAPHVIZ_NODE_SHAPE_LIBRARY_SHARED;
    case cmStateEnums::MODULE_LIBRARY:
      return GRAPHVIZ_NODE_SHAPE_LIBRARY_MODULE;
    case cmStateEnums::OBJECT_LIBRARY:
      return GRAPHVIZ_NODE_SHAPE_LIBRARY_OBJECT;
    case cmStateEnums::UTILITY:
      return GRAPHVIZ_NODE_SHAPE_UTILITY;
    case cmStateEnums::INTERFACE_LIBRARY:
      return GRAPHVIZ_NODE_SHAPE_LIBRARY_INTERFACE;
    case cmStateEnums::UNKNOWN_LIBRARY:
    default:
      return GRAPHVIZ_NODE_SHAPE_LIBRARY_UNKNOWN;
  }
}